

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o2.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::QuadO2::Jacobian(MatrixXd *__return_storage_ptr__,QuadO2 *this,MatrixXd *local)

{
  QuadO2 *pQVar1;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  variable_if_dynamic<long,__1> vVar2;
  runtime_error *this_01;
  double *pdVar3;
  long lVar4;
  Matrix<double,__1,_2,_0,__1,_2> *pMVar5;
  bool bVar6;
  Index row;
  long lVar7;
  double dVar8;
  long lVar9;
  long lVar10;
  DstEvaluatorType dstEvaluator;
  MatrixXd tmp_epsilon;
  MatrixXd tmp_gamma;
  MatrixXd tmp_epsilon_x_2;
  MatrixXd local_reversed;
  SrcEvaluatorType srcEvaluator;
  ConstReverseReturnType local_squared_reversed;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_colwise_product;
  stringstream ss;
  scalar_product_op<double,_double> local_461;
  QuadO2 *local_460;
  undefined1 local_458 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  variable_if_dynamic<long,__1> local_438;
  variable_if_dynamic<long,__1> vStack_430;
  RhsNested local_428;
  variable_if_dynamic<long,__1> local_420;
  undefined1 local_3f8 [32];
  variable_if_dynamic<long,__1> local_3d8;
  variable_if_dynamic<long,__1> vStack_3d0;
  RhsNested local_3c8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_3b8;
  Rhs local_398;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_358;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_338;
  Matrix<double,__1,_2,_0,__1,_2> *local_330;
  Matrix<double,__1,_2,_0,__1,_2> *local_328;
  pointer local_320;
  Matrix<double,__1,__1,_0,__1,__1> local_318;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_300;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>
  local_2e8;
  Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>
  local_2b0;
  undefined1 local_2a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290 [6];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_228;
  Rhs local_200;
  undefined1 local_1e8 [8];
  variable_if_dynamic<long,__1> local_1e0;
  variable_if_dynamic<long,__1> local_1d8;
  scalar_constant_op<double> local_1d0;
  RhsNested local_1c8;
  Lhs local_60;
  Lhs local_48;
  
  local_458._0_8_ = (Matrix<double,__1,_2,_0,__1,_2> *)0x0;
  local_398.m_expression.m_lhs.m_expression.m_matrix = local;
  local_338 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_2a0,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_458);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_1e8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_2a0,(Rhs *)&local_398,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_458);
  lVar4 = ((local_1c8.m_expression)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar4) {
    pdVar3 = ((local_1c8.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar10 = ((local_1c8.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    bVar6 = false;
    lVar7 = 0;
    do {
      if (0 < lVar10) {
        lVar9 = 0;
        do {
          if (pdVar3[lVar9] < local_1d0.m_other) goto LAB_0027ba43;
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
      }
      lVar7 = lVar7 + 1;
      pdVar3 = pdVar3 + lVar10;
      bVar6 = lVar4 <= lVar7;
    } while (lVar7 != lVar4);
LAB_0027ba43:
    if (!bVar6) goto LAB_0027bb12;
  }
  local_3f8._0_8_ = &DAT_3ff0000000000000;
  local_2e8.m_lhs.m_expression.m_matrix = local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_458,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)local_3f8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                   *)local_2a0,(Lhs *)&local_2e8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_458,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_3f8);
  if (0 < (long)local_290[0]._0_8_) {
    lVar4 = *(long *)local_2a0._0_8_;
    bVar6 = false;
    dVar8 = 0.0;
    do {
      if (0 < (long)local_2a0._8_8_) {
        lVar10 = 0;
        do {
          if ((double)local_290[0]._8_8_ < *(double *)(lVar4 + lVar10 * 8)) goto LAB_0027bb08;
          lVar10 = lVar10 + 1;
        } while (local_2a0._8_8_ != lVar10);
      }
      dVar8 = (double)((long)dVar8 + 1);
      lVar4 = lVar4 + *(Index *)(local_2a0._0_8_ + 8) * 8;
      bVar6 = (long)local_290[0]._0_8_ <= (long)dVar8;
    } while (dVar8 != (double)local_290[0]._0_8_);
LAB_0027bb08:
    if (!bVar6) {
LAB_0027bb12:
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1d8,"local coordinates out of bounds for reference element",0x35)
      ;
      local_2a0._0_8_ = local_290;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2a0,"(0. <= local.array()).all() && (local.array() <= 1.).all()",""
                );
      local_458._0_8_ = &local_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_458,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_2a0,(string *)local_458,0x47,(string *)local_3f8);
      if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
        operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._0_8_ != &local_448) {
        operator_delete((void *)local_458._0_8_,local_448._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._0_8_ != local_290) {
        operator_delete((void *)local_2a0._0_8_,local_290[0]._M_allocated_capacity + 1);
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"this code should not be reached");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_2b0.m_matrix.m_xpr.m_expression = local;
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1e8,local,
             0);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_458,local,
             1);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                   *)local_2a0,
                  (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1e8,
                  (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_458,
                  (scalar_product_op<double,_double> *)local_3f8);
  local_3b8.m_storage.m_data = (double *)0x0;
  local_3b8.m_storage.m_rows = 0;
  local_3b8.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_3b8,
             (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
             .m_rows,(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols * 2);
  local_1e8 = (undefined1  [8])&this->epsilon_x_2_;
  local_1d8.m_value =
       (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_1e0.m_value = 1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_318,
             (DenseBase<Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>_> *)
             local_1e8);
  local_358.m_storage.m_data = (double *)0x0;
  local_358.m_storage.m_rows = 0;
  local_358.m_storage.m_cols = 0;
  local_460 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_358,
             (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
             .m_rows,(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols * 2);
  if (0 < (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
     ) {
    local_328 = &local_460->epsilon_;
    local_330 = &local_460->gamma_x_2_;
    lVar4 = 0;
    do {
      local_398.m_expression.m_lhs.m_expression.m_matrix = (MatrixTypeNested)local_328;
      Eigen::
      Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_0>,_-1,_1,_true>
      ::Block((Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>,__1,_1,_true>
               *)local_3f8,&local_2b0,lVar4);
      local_428 = *(RhsNested *)((long)local_398.m_expression.m_lhs.m_expression.m_matrix + 8);
      local_458._0_8_ = local_3f8._0_8_;
      local_438.m_value = local_3d8.m_value;
      local_448._M_allocated_capacity = local_3f8._16_8_;
      local_448._8_8_ = local_3f8._24_8_;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_1>_>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_0>,_-1,_1,_true>_>,_-1,_1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_1>_>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>,__1,_1,_true>_>,__1,_1>_>
                       *)local_1e8,(Lhs *)&local_398,(Rhs *)local_458,
                      (scalar_product_op<double,_double> *)&local_2e8);
      lVar10 = lVar4 * 2;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_458,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_3b8,0,lVar10,local_3b8.m_storage.m_rows
                 ,2);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Reverse<Eigen::Matrix<double,_1,2,0,_1,2>const,1>const>const,Eigen::Replicate<Eigen::Transpose<Eigen::Block<Eigen::Reverse<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,0>,_1,1,true>>,_1,1>const>,Eigen::internal::assign_op<double,double>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_458,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_1>_>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>,__1,_1,_true>_>,__1,_1>_>
                  *)local_1e8,(assign_op<double,_double> *)&local_2e8);
      local_320 = (pointer)Eigen::
                           DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>
                           ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>
                                         *)local_2a0,lVar4);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1e8,
                 &local_318,0,lVar10,
                 local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows,2);
      local_458._0_8_ = local_320;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)&local_398,local_1e0.m_value,local_1d8.m_value,
                       (scalar_constant_op<double> *)local_458);
      local_2e8.m_lhs.m_expression.m_matrix =
           (MatrixTypeNested)local_398.m_expression.m_lhs.m_expression.m_colFactor.m_value;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::mul_assign_op<double,double>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1e8,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_398,(mul_assign_op<double,_double> *)&local_228);
      local_3f8._0_8_ = local_1e8;
      local_3f8._16_8_ = *(double *)((long)local_1d0.m_other + 8);
      local_458._0_8_ = local_3f8;
      local_448._M_allocated_capacity = (size_type)&local_228;
      local_458._8_8_ = &local_2e8;
      local_448._8_8_ =
           (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>,__1,_1>_>
            *)local_1e8;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
             *)local_458);
      local_398.m_expression.m_lhs.m_expression.m_matrix = (MatrixTypeNested)local_330;
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_3f8,
                 local,lVar4);
      local_420.m_value = *(Index *)((long)local_398.m_expression.m_lhs.m_expression.m_matrix + 8);
      local_458._0_8_ = local_3f8._0_8_;
      local_458._8_8_ = local_3f8._8_8_;
      local_448._M_allocated_capacity = local_3f8._16_8_;
      local_448._8_8_ = local_3f8._24_8_;
      local_438.m_value = local_3d8.m_value;
      vStack_430.m_value = vStack_3d0.m_value;
      local_428 = local_3c8;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>,_-1,_1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>,__1,_1>_>
                       *)local_1e8,(Lhs *)&local_398,(Rhs *)local_458,
                      (scalar_product_op<double,_double> *)&local_2e8);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_458,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_358,0,lVar10,local_358.m_storage.m_rows
                 ,2);
      vVar2.m_value = local_1e0.m_value;
      pdVar3 = (((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_1e8)->m_storage).
               m_data;
      lVar10 = (((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_1e8)->m_storage).
               m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,2,0,_1,2>const>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>const>,_1,1>const>,double,double>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_458,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>,__1,_1>_>
                  *)local_1e8,(assign_op<double,_double> *)&local_2e8);
      if (0 < (long)local_448._M_allocated_capacity) {
        lVar7 = *(long *)(local_448._8_8_ + 8);
        dVar8 = 0.0;
        pMVar5 = (Matrix<double,__1,_2,_0,__1,_2> *)local_458._0_8_;
        do {
          if (0 < (long)local_458._8_8_) {
            lVar9 = 0;
            do {
              (&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>).m_storage.
                m_data)[lVar9] =
                   (double *)(*(double *)(vVar2.m_value + (long)dVar8 * 8) * pdVar3[lVar9]);
              lVar9 = lVar9 + 1;
            } while (local_458._8_8_ != lVar9);
          }
          dVar8 = (double)((long)dVar8 + 1);
          pdVar3 = pdVar3 + lVar10;
          pMVar5 = (Matrix<double,__1,_2,_0,__1,_2> *)
                   (&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>).
                     m_storage.m_data + lVar7);
        } while (dVar8 != (double)local_448._M_allocated_capacity);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols);
  }
  local_1e8 = (undefined1  [8])local;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_300,
             (DenseBase<Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_> *)
             local_1e8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_300,1,
             (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols * (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows);
  pQVar1 = local_460;
  local_48.m_matrix = &local_460->beta_;
  local_48.m_colFactor.m_value =
       (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_48.m_rowFactor.m_value = 1;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseBinaryOp(&local_228,&local_48,(Rhs *)&local_358,(scalar_sum_op<double,_double> *)&local_398
                 );
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   *)local_3f8,&local_228,(Rhs *)&local_3b8,
                  (scalar_sum_op<double,_double> *)&local_398);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   *)local_458,(Lhs *)local_3f8,&local_318,
                  (scalar_sum_op<double,_double> *)&local_398);
  local_60.m_expression.m_rowFactor.m_value =
       (pQVar1->delta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows;
  local_200.m_matrix.m_expression = &pQVar1->delta_;
  local_60.m_expression.m_colFactor.m_value = 1;
  local_200.m_colFactor.m_value = local_300.m_storage.m_cols;
  local_60.m_expression.m_matrix = (MatrixTypeNested)&local_300;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1,_-1>_>
  ::CwiseBinaryOp(&local_2e8,&local_60,&local_200,&local_461);
  this_00 = local_338;
  local_398.m_expression.m_lhs.m_expression.m_matrix = local_2e8.m_lhs.m_expression.m_matrix;
  local_398.m_expression.m_lhs.m_expression.m_rowFactor.m_value =
       local_2e8.m_lhs.m_expression.m_rowFactor.m_value;
  local_398.m_expression.m_lhs.m_expression.m_colFactor.m_value =
       local_2e8.m_lhs.m_expression.m_colFactor.m_value;
  local_398.m_expression.m_rhs.m_matrix.m_expression = local_2e8.m_rhs.m_matrix.m_expression;
  local_398.m_expression.m_rhs._8_8_ = local_2e8.m_rhs._8_8_;
  local_398.m_expression.m_rhs.m_colFactor.m_value = local_2e8.m_rhs.m_colFactor.m_value;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1,_-1>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>
                   *)local_1e8,(Lhs *)local_458,&local_398,
                  (scalar_sum_op<double,_double> *)&local_200);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Replicate<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1>const>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,1,_1>const>>const>>
            (this_00,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>_>
                      *)local_1e8);
  free(local_300.m_storage.m_data);
  free(local_358.m_storage.m_data);
  free(local_318.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_3b8.m_storage.m_data);
  return (MatrixXd *)this_00;
}

Assistant:

Eigen::MatrixXd QuadO2::Jacobian(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  auto local_squared_reversed = local.array().square().colwise().reverse();
  auto local_colwise_product = local.row(0).cwiseProduct(local.row(1));

  Eigen::MatrixXd tmp_epsilon(gamma_.rows(), 2 * local.cols());
  Eigen::MatrixXd tmp_epsilon_x_2 = epsilon_x_2_.replicate(1, local.cols());
  Eigen::MatrixXd tmp_gamma(gamma_.rows(), 2 * local.cols());

  for (long i = 0; i < local.cols(); ++i) {
    tmp_epsilon.block(0, 2 * i, tmp_epsilon.rows(), 2) =
        epsilon_.rowwise().reverse().array().rowwise() *
        local_squared_reversed.col(i).transpose().array();
    tmp_epsilon_x_2.block(0, 2 * i, tmp_epsilon_x_2.rows(), 2) *=
        local_colwise_product(i);
    tmp_gamma.block(0, 2 * i, tmp_gamma.rows(), 2) =
        gamma_x_2_.array().rowwise() * local.col(i).transpose().array();
  }

  Eigen::MatrixXd local_reversed = local.colwise().reverse();
  local_reversed.resize(1, local.size());

  return beta_.replicate(1, local.cols()) + tmp_gamma + tmp_epsilon +
         tmp_epsilon_x_2 +
         (local_reversed.replicate(delta_.rows(), 1).array().colwise() *
          delta_.array())
             .matrix();
}